

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::XFileParser::XFileParser(XFileParser *this,vector<char,_std::allocator<char>_> *pBuffer)

{
  char *pcVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  DeadlyImportError *pDVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *pbVar7;
  reference pvVar8;
  Logger *this_00;
  Scene *this_01;
  allocator local_4c1;
  string local_4c0;
  int local_4a0;
  undefined1 local_49a;
  allocator local_499;
  int ret;
  ushort local_472;
  reference pvStack_470;
  uint16_t ofs_1;
  char *out;
  string local_460;
  ushort local_43c;
  undefined1 local_43a;
  allocator local_439;
  undefined1 local_438 [4];
  uint16_t magic;
  ushort local_416;
  int local_414;
  uint16_t ofs;
  ushort *puStack_410;
  uint est_out;
  char *P1;
  z_stream stream;
  string local_220;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_88;
  byte local_66;
  undefined1 local_65;
  bool compressed;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> uncompressed;
  vector<char,_std::allocator<char>_> *pBuffer_local;
  XFileParser *this_local;
  
  this->mMajorVersion = 0;
  this->mMinorVersion = 0;
  this->mIsBinaryFormat = false;
  this->mBinaryNumCount = 0;
  this->mP = (char *)0x0;
  this->mEnd = (char *)0x0;
  this->mLineNumber = 0;
  this->mScene = (Scene *)0x0;
  uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = pBuffer;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_30);
  pvVar3 = std::vector<char,_std::allocator<char>_>::front
                     ((vector<char,_std::allocator<char>_> *)
                      uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  this->mP = pvVar3;
  pcVar1 = this->mP;
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)
                     uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  this->mEnd = pcVar1 + (sVar4 - 1);
  iVar2 = strncmp(this->mP,"xof ",4);
  if (iVar2 != 0) {
    local_65 = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"Header mismatch, file is not an XFile.",&local_51);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_50);
    local_65 = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this->mMajorVersion = (this->mP[4] + -0x30) * 10 + this->mP[5] + -0x30;
  this->mMinorVersion = (this->mP[6] + -0x30) * 10 + this->mP[7] + -0x30;
  local_66 = 0;
  iVar2 = strncmp(this->mP + 8,"txt ",4);
  if (iVar2 == 0) {
    this->mIsBinaryFormat = false;
  }
  else {
    iVar2 = strncmp(this->mP + 8,"bin ",4);
    if (iVar2 == 0) {
      this->mIsBinaryFormat = true;
    }
    else {
      iVar2 = strncmp(this->mP + 8,"tzip",4);
      if (iVar2 == 0) {
        this->mIsBinaryFormat = false;
      }
      else {
        iVar2 = strncmp(this->mP + 8,"bzip",4);
        if (iVar2 != 0) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_200);
          pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_200,(char (*) [27])"Unsupported xfile format \'");
          pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar6,this->mP + 8);
          pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar6,this->mP + 9);
          pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar6,this->mP + 10);
          pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar6,this->mP + 0xb);
          pbVar7 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar6,(char (*) [2])0xc2e488);
          Formatter::basic_formatter::operator_cast_to_string(&local_88,pbVar7);
          ThrowException(this,&local_88);
        }
        this->mIsBinaryFormat = true;
      }
      local_66 = 1;
    }
  }
  this->mBinaryFloatSize =
       (this->mP[0xc] + -0x30) * 1000 + (this->mP[0xd] + -0x30) * 100 + (this->mP[0xe] + -0x30) * 10
       + this->mP[0xf] + -0x30;
  if ((this->mBinaryFloatSize != 0x20) && (this->mBinaryFloatSize != 0x40)) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stream.reserved);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &stream.reserved,(char (*) [20])"Unknown float size ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,&this->mBinaryFloatSize);
    pbVar7 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(char (*) [28])" specified in xfile header.");
    Formatter::basic_formatter::operator_cast_to_string(&local_220,pbVar7);
    ThrowException(this,&local_220);
  }
  this->mBinaryFloatSize = this->mBinaryFloatSize >> 3;
  this->mP = this->mP + 0x10;
  if ((local_66 & 1) == 0) {
    ReadUntilEndOfLine(this);
  }
  else {
    stream.zfree = (free_func)0x0;
    stream.state = (internal_state *)dummy_alloc;
    stream.zalloc = dummy_free;
    stream.opaque._0_4_ = (byte)~this->mIsBinaryFormat & 1;
    inflateInit2_(&P1,0xfffffff1,"1.2.11",0x70);
    this->mP = this->mP + 6;
    puStack_410 = (ushort *)this->mP;
    local_414 = 0;
    for (; (char *)((long)puStack_410 + 3U) < this->mEnd;
        puStack_410 = (ushort *)((long)puStack_410 + (long)(int)(uint)local_416)) {
      local_416 = *puStack_410;
      if (0x8011 < local_416) {
        local_43a = 1;
        puStack_410 = puStack_410 + 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_438,"X: Invalid offset to next MSZIP compressed block",&local_439
                  );
        DeadlyImportError::DeadlyImportError(pDVar5,(string *)local_438);
        local_43a = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_43c = puStack_410[1];
      puStack_410 = puStack_410 + 2;
      if (local_43c != 0x4b43) {
        out._6_1_ = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_460,"X: Unsupported compressed format, expected MSZIP header",
                   (allocator *)((long)&out + 7));
        DeadlyImportError::DeadlyImportError(pDVar5,&local_460);
        out._6_1_ = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_414 = local_414 + 0x8012;
      local_43c = 0x4b43;
    }
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_30,(ulong)(local_414 + 1));
    pvStack_470 = std::vector<char,_std::allocator<char>_>::front
                            ((vector<char,_std::allocator<char>_> *)local_30);
    while (this->mP + 3 < this->mEnd) {
      local_472 = *(ushort *)this->mP;
      this->mP = this->mP + 4;
      if (this->mEnd + 2 < this->mP + (int)(uint)local_472) {
        local_49a = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ret,"X: Unexpected EOF in compressed chunk",&local_499);
        DeadlyImportError::DeadlyImportError(pDVar5,(string *)&ret);
        local_49a = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      P1 = this->mP;
      stream.next_in._0_4_ = (uint)local_472;
      stream.total_in = (uLong)pvStack_470;
      stream.next_out._0_4_ = 0x8012;
      local_4a0 = inflate(&P1,2);
      if ((local_4a0 != 0) && (local_4a0 != 1)) {
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_4c0,"X: Failed to decompress MSZIP-compressed data",&local_4c1);
        DeadlyImportError::DeadlyImportError(pDVar5,&local_4c0);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      inflateReset(&P1);
      inflateSetDictionary(&P1,pvStack_470,0x8012 - (int)stream.next_out);
      pvStack_470 = pvStack_470 + (0x8012 - (int)stream.next_out);
      this->mP = this->mP + (int)(uint)local_472;
    }
    inflateEnd(&P1);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,0);
    this->mP = pvVar8;
    this->mEnd = pvStack_470;
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Successfully decompressed MSZIP-compressed file");
  }
  this_01 = (Scene *)operator_new(0x58);
  XFile::Scene::Scene(this_01);
  this->mScene = this_01;
  ParseFile(this);
  if (this->mScene->mRootNode != (Node *)0x0) {
    FilterHierarchy(this,this->mScene->mRootNode);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return;
}

Assistant:

XFileParser::XFileParser( const std::vector<char>& pBuffer)
: mMajorVersion( 0 )
, mMinorVersion( 0 )
, mIsBinaryFormat( false )
, mBinaryNumCount( 0 )
, mP( nullptr )
, mEnd( nullptr )
, mLineNumber( 0 )
, mScene( nullptr ) {
    // vector to store uncompressed file for INFLATE'd X files
    std::vector<char> uncompressed;

    // set up memory pointers
    mP = &pBuffer.front();
    mEnd = mP + pBuffer.size() - 1;

    // check header
    if ( 0 != strncmp( mP, "xof ", 4 ) ) {
        throw DeadlyImportError( "Header mismatch, file is not an XFile." );
    }

    // read version. It comes in a four byte format such as "0302"
    mMajorVersion = (unsigned int)(mP[4] - 48) * 10 + (unsigned int)(mP[5] - 48);
    mMinorVersion = (unsigned int)(mP[6] - 48) * 10 + (unsigned int)(mP[7] - 48);

    bool compressed = false;

    // txt - pure ASCII text format
    if( strncmp( mP + 8, "txt ", 4) == 0)
        mIsBinaryFormat = false;

    // bin - Binary format
    else if( strncmp( mP + 8, "bin ", 4) == 0)
        mIsBinaryFormat = true;

    // tzip - Inflate compressed text format
    else if( strncmp( mP + 8, "tzip", 4) == 0)
    {
        mIsBinaryFormat = false;
        compressed = true;
    }
    // bzip - Inflate compressed binary format
    else if( strncmp( mP + 8, "bzip", 4) == 0)
    {
        mIsBinaryFormat = true;
        compressed = true;
    }
    else ThrowException( format() << "Unsupported xfile format '" <<
       mP[8] << mP[9] << mP[10] << mP[11] << "'");

    // float size
    mBinaryFloatSize = (unsigned int)(mP[12] - 48) * 1000
        + (unsigned int)(mP[13] - 48) * 100
        + (unsigned int)(mP[14] - 48) * 10
        + (unsigned int)(mP[15] - 48);

    if( mBinaryFloatSize != 32 && mBinaryFloatSize != 64)
        ThrowException( format() << "Unknown float size " << mBinaryFloatSize << " specified in xfile header." );

    // The x format specifies size in bits, but we work in bytes
    mBinaryFloatSize /= 8;

    mP += 16;

    // If this is a compressed X file, apply the inflate algorithm to it
    if (compressed)
    {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_X
        throw DeadlyImportError("Assimp was built without compressed X support");
#else
        /* ///////////////////////////////////////////////////////////////////////
         * COMPRESSED X FILE FORMAT
         * ///////////////////////////////////////////////////////////////////////
         *    [xhead]
         *    2 major
         *    2 minor
         *    4 type    // bzip,tzip
         *    [mszip_master_head]
         *    4 unkn    // checksum?
         *    2 unkn    // flags? (seems to be constant)
         *    [mszip_head]
         *    2 ofs     // offset to next section
         *    2 magic   // 'CK'
         *    ... ofs bytes of data
         *    ... next mszip_head
         *
         *  http://www.kdedevelopers.org/node/3181 has been very helpful.
         * ///////////////////////////////////////////////////////////////////////
         */

        // build a zlib stream
        z_stream stream;
        stream.opaque = NULL;
        stream.zalloc = &dummy_alloc;
        stream.zfree  = &dummy_free;
        stream.data_type = (mIsBinaryFormat ? Z_BINARY : Z_ASCII);

        // initialize the inflation algorithm
        ::inflateInit2(&stream, -MAX_WBITS);

        // skip unknown data (checksum, flags?)
        mP += 6;

        // First find out how much storage we'll need. Count sections.
        const char* P1       = mP;
        unsigned int est_out = 0;

        while (P1 + 3 < mEnd)
        {
            // read next offset
            uint16_t ofs = *((uint16_t*)P1);
            AI_SWAP2(ofs); P1 += 2;

            if (ofs >= MSZIP_BLOCK)
                throw DeadlyImportError("X: Invalid offset to next MSZIP compressed block");

            // check magic word
            uint16_t magic = *((uint16_t*)P1);
            AI_SWAP2(magic); P1 += 2;

            if (magic != MSZIP_MAGIC)
                throw DeadlyImportError("X: Unsupported compressed format, expected MSZIP header");

            // and advance to the next offset
            P1 += ofs;
            est_out += MSZIP_BLOCK; // one decompressed block is 32786 in size
        }

        // Allocate storage and terminating zero and do the actual uncompressing
        uncompressed.resize(est_out + 1);
        char* out = &uncompressed.front();
        while (mP + 3 < mEnd)
        {
            uint16_t ofs = *((uint16_t*)mP);
            AI_SWAP2(ofs);
            mP += 4;

            if (mP + ofs > mEnd + 2) {
                throw DeadlyImportError("X: Unexpected EOF in compressed chunk");
            }

            // push data to the stream
            stream.next_in   = (Bytef*)mP;
            stream.avail_in  = ofs;
            stream.next_out  = (Bytef*)out;
            stream.avail_out = MSZIP_BLOCK;

            // and decompress the data ....
            int ret = ::inflate( &stream, Z_SYNC_FLUSH );
            if (ret != Z_OK && ret != Z_STREAM_END)
                throw DeadlyImportError("X: Failed to decompress MSZIP-compressed data");

            ::inflateReset( &stream );
            ::inflateSetDictionary( &stream, (const Bytef*)out , MSZIP_BLOCK - stream.avail_out );

            // and advance to the next offset
            out +=  MSZIP_BLOCK - stream.avail_out;
            mP   += ofs;
        }

        // terminate zlib
        ::inflateEnd(&stream);

        // ok, update pointers to point to the uncompressed file data
        mP = &uncompressed[0];
        mEnd = out;

        // FIXME: we don't need the compressed data anymore, could release
        // it already for better memory usage. Consider breaking const-co.
        ASSIMP_LOG_INFO("Successfully decompressed MSZIP-compressed file");
#endif // !! ASSIMP_BUILD_NO_COMPRESSED_X
    }
    else
    {
        // start reading here
        ReadUntilEndOfLine();
    }

    mScene = new Scene;
    ParseFile();

    // filter the imported hierarchy for some degenerated cases
    if( mScene->mRootNode) {
        FilterHierarchy( mScene->mRootNode);
    }
}